

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O1

void __thiscall wabt::MemoryStream::~MemoryStream(MemoryStream *this)

{
  OutputBuffer *__ptr;
  
  (this->super_Stream)._vptr_Stream = (_func_int **)&PTR__MemoryStream_0022ab30;
  __ptr = (this->buf_)._M_t.
          super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>._M_t.
          super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>.
          super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl;
  if (__ptr != (OutputBuffer *)0x0) {
    std::default_delete<wabt::OutputBuffer>::operator()
              ((default_delete<wabt::OutputBuffer> *)&this->buf_,__ptr);
  }
  (this->buf_)._M_t.
  super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>._M_t.
  super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>.
  super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl = (OutputBuffer *)0x0;
  operator_delete(this,0x28);
  return;
}

Assistant:

MemoryStream(MemoryStream&&) = default;